

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Indexer.cpp
# Opt level: O2

void __thiscall
Indexer::Indexer(Indexer *this,DatabaseSnapshot *snap,
                vector<IndexType,_std::allocator<IndexType>_> *types)

{
  _Vector_base<IndexType,_std::allocator<IndexType>_> local_50;
  _Vector_base<IndexType,_std::allocator<IndexType>_> local_38;
  
  this->snap = snap;
  std::vector<IndexType,_std::allocator<IndexType>_>::vector(&this->types,types);
  std::vector<IndexType,_std::allocator<IndexType>_>::vector
            ((vector<IndexType,_std::allocator<IndexType>_> *)&local_38,types);
  DatasetBuilder::DatasetBuilder
            (&this->flat_builder,FLAT,(vector<IndexType,_std::allocator<IndexType>_> *)&local_38);
  std::_Vector_base<IndexType,_std::allocator<IndexType>_>::~_Vector_base(&local_38);
  std::vector<IndexType,_std::allocator<IndexType>_>::vector
            ((vector<IndexType,_std::allocator<IndexType>_> *)&local_50,types);
  DatasetBuilder::DatasetBuilder
            (&this->bitmap_builder,BITMAP,(vector<IndexType,_std::allocator<IndexType>_> *)&local_50
            );
  std::_Vector_base<IndexType,_std::allocator<IndexType>_>::~_Vector_base(&local_50);
  (this->created_datasets).
  super__Vector_base<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->created_datasets).
  super__Vector_base<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->created_datasets).
  super__Vector_base<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Indexer::Indexer(const DatabaseSnapshot *snap,
                 const std::vector<IndexType> &types)
    : snap(snap),
      types(types),
      flat_builder(BuilderType::FLAT, types),
      bitmap_builder(BuilderType::BITMAP, types) {}